

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionArgumentPushConstant
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  DiagnosticStream *pDVar4;
  undefined1 local_5b8 [4];
  spv_result_t error_1;
  DiagnosticStream local_3e0;
  DiagnosticStream local_208;
  spv_result_t local_2c;
  size_type sStack_28;
  spv_result_t error;
  size_type num_operands;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  num_operands = (size_type)inst;
  inst_local = (Instruction *)_;
  this = val::Instruction::operands(inst);
  sStack_28 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
  local_2c = ValidateKernelDecl((ValidationState_t *)inst_local,(Instruction *)num_operands);
  pIVar1 = inst_local;
  __local._4_4_ = local_2c;
  if (local_2c == SPV_SUCCESS) {
    uVar3 = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,5);
    bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
    pIVar1 = inst_local;
    if (bVar2) {
      uVar3 = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,6);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,7);
        bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
        if (bVar2) {
          if ((sStack_28 != 9) ||
             (__local._4_4_ =
                   ValidateArgInfo((ValidationState_t *)inst_local,(Instruction *)num_operands,8),
             __local._4_4_ == SPV_SUCCESS)) {
            __local._4_4_ = SPV_SUCCESS;
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_5b8,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_ID,(Instruction *)num_operands);
          pDVar4 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_5b8,(char (*) [50])0xd21ce1);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5b8);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar4 = DiagnosticStream::operator<<(&local_3e0,(char (*) [52])0xd21e5d);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_3e0);
      }
    }
    else {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)num_operands);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_208,
                          (char (*) [53])"Ordinal must be a 32-bit unsigned integer OpConstant");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionArgumentPushConstant(
    ValidationState_t& _, const Instruction* inst) {
  const auto num_operands = inst->operands().size();
  if (auto error = ValidateKernelDecl(_, inst)) {
    return error;
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Ordinal must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  if (num_operands == 9) {
    if (auto error = ValidateArgInfo(_, inst, 8)) {
      return error;
    }
  }

  return SPV_SUCCESS;
}